

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_gl_engine.cpp
# Opt level: O0

void __thiscall
polyscope::render::backend_openGL_mock::GLCompiledProgram::addUniqueAttribute
          (GLCompiledProgram *this,ShaderSpecAttribute *newAttribute)

{
  bool bVar1;
  __type _Var2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  GLShaderAttribute *a;
  iterator __end2;
  iterator __begin2;
  vector<polyscope::render::backend_openGL_mock::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderAttribute>_>
  *__range2;
  value_type *in_stack_ffffffffffffff18;
  __normal_iterator<polyscope::render::backend_openGL_mock::GLShaderAttribute_*,_std::vector<polyscope::render::backend_openGL_mock::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderAttribute>_>_>
  *in_stack_ffffffffffffff20;
  GLShaderAttribute *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  string local_b8 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  string *in_stack_ffffffffffffff80;
  string local_70 [32];
  string local_50 [32];
  reference local_30;
  GLShaderAttribute *local_28;
  __normal_iterator<polyscope::render::backend_openGL_mock::GLShaderAttribute_*,_std::vector<polyscope::render::backend_openGL_mock::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderAttribute>_>_>
  local_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  
  local_18 = in_RDI + 1;
  local_20._M_current =
       (GLShaderAttribute *)
       std::
       vector<polyscope::render::backend_openGL_mock::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderAttribute>_>
       ::begin((vector<polyscope::render::backend_openGL_mock::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderAttribute>_>
                *)in_stack_ffffffffffffff18);
  local_28 = (GLShaderAttribute *)
             std::
             vector<polyscope::render::backend_openGL_mock::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderAttribute>_>
             ::end((vector<polyscope::render::backend_openGL_mock::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderAttribute>_>
                    *)in_stack_ffffffffffffff18);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffff20,
                       (__normal_iterator<polyscope::render::backend_openGL_mock::GLShaderAttribute_*,_std::vector<polyscope::render::backend_openGL_mock::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderAttribute>_>_>
                        *)in_stack_ffffffffffffff18);
    if (!bVar1) {
      this_00 = (GLShaderAttribute *)(in_RDI + 1);
      std::__cxx11::string::string(local_b8,(string *)in_RSI);
      std::shared_ptr<polyscope::render::backend_openGL_mock::GLAttributeBuffer>::shared_ptr
                ((shared_ptr<polyscope::render::backend_openGL_mock::GLAttributeBuffer> *)this_00,
                 in_stack_ffffffffffffff18);
      std::
      vector<polyscope::render::backend_openGL_mock::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderAttribute>_>
      ::push_back((vector<polyscope::render::backend_openGL_mock::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderAttribute>_>
                   *)this_00,in_stack_ffffffffffffff18);
      GLShaderAttribute::~GLShaderAttribute(this_00);
      return;
    }
    local_30 = __gnu_cxx::
               __normal_iterator<polyscope::render::backend_openGL_mock::GLShaderAttribute_*,_std::vector<polyscope::render::backend_openGL_mock::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderAttribute>_>_>
               ::operator*(&local_20);
    _Var2 = std::operator==(in_RDI,in_RSI);
    if (_Var2) break;
    __gnu_cxx::
    __normal_iterator<polyscope::render::backend_openGL_mock::GLShaderAttribute_*,_std::vector<polyscope::render::backend_openGL_mock::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderAttribute>_>_>
    ::operator++(&local_20);
  }
  if (local_30->type == *(RenderDataType *)(in_RSI + 1)) {
    return;
  }
  std::operator+((char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                 in_stack_ffffffffffffff60);
  std::operator+(in_stack_ffffffffffffff28,(char *)in_stack_ffffffffffffff20);
  exception(in_stack_ffffffffffffff80);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_70);
  return;
}

Assistant:

void GLCompiledProgram::addUniqueAttribute(ShaderSpecAttribute newAttribute) {
  for (GLShaderAttribute& a : attributes) {
    if (a.name == newAttribute.name) {

      // if it occurs twice, confirm that the occurences match
      if (a.type != newAttribute.type)
        exception("attribute " + a.name + " appears twice in program with different types");

      return;
    }
  }
  attributes.push_back(GLShaderAttribute{newAttribute.name, newAttribute.type, newAttribute.arrayCount, nullptr});
}